

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theme.cpp
# Opt level: O0

void __thiscall gui::Theme::Theme(Theme *this,Gui *gui)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Theme_002f5fe0;
  in_RDI[1] = in_RSI;
  memset(in_RDI + 2,0,0x30);
  std::
  map<sf::String,_std::shared_ptr<gui::Style>,_std::less<sf::String>,_std::allocator<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>_>
  ::map((map<sf::String,_std::shared_ptr<gui::Style>,_std::less<sf::String>,_std::allocator<std::pair<const_sf::String,_std::shared_ptr<gui::Style>_>_>_>
         *)0x1dbdd7);
  return;
}

Assistant:

Theme::Theme(const Gui& gui) :
    gui_(gui),
    styles_() {
}